

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswUnique.c
# Opt level: O1

void Ssw_UniqueRegisterPairInfo(Ssw_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Aig_Man_t *pAVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  if (p->vDiffPairs == (Vec_Int_t *)0x0) {
    iVar3 = p->pAig->nRegs;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    iVar10 = 0x10;
    if (0xe < iVar3 - 1U) {
      iVar10 = iVar3;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar10;
    if (iVar10 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)iVar10 << 2);
    }
    pVVar4->pArray = piVar5;
    p->vDiffPairs = pVVar4;
  }
  p->vDiffPairs->nSize = 0;
  pAVar6 = p->pAig;
  iVar3 = pAVar6->nRegs;
  if (0 < iVar3) {
    iVar10 = 0;
    do {
      uVar8 = pAVar6->nTruePis + iVar10;
      if (((int)uVar8 < 0) || (pAVar6->vCis->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar7 = (long)*(int *)((long)pAVar6->vCis->pArray[uVar8] + 0x24) * (long)p->nFrames;
      pAVar1 = p->pNodeToFrames[lVar7];
      pAVar2 = p->pNodeToFrames[(long)(int)lVar7 + 1];
      if (pAVar1 == pAVar2) {
        pVVar4 = p->vDiffPairs;
        uVar8 = 0;
      }
      else {
        if (pAVar1 != (Aig_Obj_t *)((ulong)pAVar2 ^ 1)) {
          uVar8 = 1;
          uVar9 = 1;
          if (pAVar1 != (Aig_Obj_t *)0x0) {
            uVar9 = ((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1
            ;
          }
          if (pAVar2 != (Aig_Obj_t *)0x0) {
            uVar8 = ((uint)pAVar2 ^ *(uint *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) >> 3) & 1
            ;
          }
          if (uVar9 == uVar8) {
            iVar3 = Ssw_NodesAreEquiv(p,(Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe),
                                      (Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe));
            pVVar4 = p->vDiffPairs;
            uVar8 = (uint)(iVar3 != 1);
            goto LAB_00620d20;
          }
        }
        pVVar4 = p->vDiffPairs;
        uVar8 = 1;
      }
LAB_00620d20:
      Vec_IntPush(pVVar4,uVar8);
      iVar10 = iVar10 + 1;
      pAVar6 = p->pAig;
      iVar3 = pAVar6->nRegs;
    } while (iVar10 < iVar3);
  }
  if (p->vDiffPairs->nSize == iVar3) {
    return;
  }
  __assert_fail("Vec_IntSize(p->vDiffPairs) == Saig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswUnique.c"
                ,0x46,"void Ssw_UniqueRegisterPairInfo(Ssw_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs computation of signal correspondence with constraints.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_UniqueRegisterPairInfo( Ssw_Man_t * p )
{
    Aig_Obj_t * pObjLo, * pObj0, * pObj1;
    int i, RetValue, Counter;
    if ( p->vDiffPairs == NULL )
        p->vDiffPairs = Vec_IntAlloc( Saig_ManRegNum(p->pAig) );
    Vec_IntClear( p->vDiffPairs );
    Saig_ManForEachLo( p->pAig, pObjLo, i )
    {
        pObj0 = Ssw_ObjFrame( p, pObjLo, 0 );
        pObj1 = Ssw_ObjFrame( p, pObjLo, 1 );
        if ( pObj0 == pObj1 )
            Vec_IntPush( p->vDiffPairs, 0 );
        else if ( pObj0 == Aig_Not(pObj1) )
            Vec_IntPush( p->vDiffPairs, 1 );
//        else
//            Vec_IntPush( p->vDiffPairs, 1 );
        else if ( Aig_ObjPhaseReal(pObj0) != Aig_ObjPhaseReal(pObj1) )
            Vec_IntPush( p->vDiffPairs, 1 );
        else
        {
            RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObj0), Aig_Regular(pObj1) );
            Vec_IntPush( p->vDiffPairs, RetValue!=1 );
        }
    }
    assert( Vec_IntSize(p->vDiffPairs) == Saig_ManRegNum(p->pAig) );
    // count the number of ones
    Counter = 0;
    Vec_IntForEachEntry( p->vDiffPairs, RetValue, i )
        Counter += RetValue;
//    Abc_Print( 1, "The number of different register pairs = %d.\n", Counter );
}